

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argh.h
# Opt level: O1

string_stream * __thiscall
argh::parser::operator()
          (string_stream *__return_storage_ptr__,parser *this,
          initializer_list<const_char_*const> init_list,double *def_val)

{
  long lVar1;
  const_iterator cVar2;
  size_type sVar3;
  bool bVar4;
  ostringstream ostr;
  allocator local_1f1;
  istringstream *local_1f0;
  size_type local_1e8;
  undefined1 *local_1e0;
  long local_1d8;
  undefined1 local_1d0 [16];
  double *local_1c0;
  multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_1b8;
  iterator local_1b0;
  key_type local_1a8 [3];
  ios_base local_138 [264];
  
  local_1e8 = init_list._M_len;
  local_1b0 = init_list._M_array;
  bVar4 = local_1e8 == 0;
  local_1f0 = (istringstream *)__return_storage_ptr__;
  local_1c0 = def_val;
  if (!bVar4) {
    local_1b8 = &this->params_;
    local_1e8 = local_1e8 << 3;
    sVar3 = 0;
    do {
      std::__cxx11::string::string
                ((string *)&local_1e0,*(char **)((long)local_1b0 + sVar3),&local_1f1);
      lVar1 = std::__cxx11::string::find_first_not_of((char)(string *)&local_1e0,0x2d);
      if (lVar1 == -1) {
        local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1a8,local_1e0,local_1e0 + local_1d8);
      }
      else {
        std::__cxx11::string::substr((ulong)local_1a8,(ulong)&local_1e0);
      }
      cVar2 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(&local_1b8->_M_t,local_1a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
        operator_delete(local_1a8[0]._M_dataplus._M_p);
      }
      if (local_1e0 != local_1d0) {
        operator_delete(local_1e0);
      }
      if (&(this->params_)._M_t._M_impl.super__Rb_tree_header != (_Rb_tree_header *)cVar2._M_node) {
        std::__cxx11::istringstream::istringstream(local_1f0,(string *)(cVar2._M_node + 2),_S_in);
        if (!bVar4) {
          return (string_stream *)local_1f0;
        }
        break;
      }
      sVar3 = sVar3 + 8;
      bVar4 = local_1e8 == sVar3;
    } while (!bVar4);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  *(undefined8 *)
   ((long)&local_1a8[0]._M_string_length + *(long *)(local_1a8[0]._M_dataplus._M_p + -0x18)) = 0x15;
  std::ostream::_M_insert<double>(*local_1c0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::istringstream::istringstream(local_1f0,(string *)&local_1e0,_S_in);
  if (local_1e0 != local_1d0) {
    operator_delete(local_1e0);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return (string_stream *)local_1f0;
}

Assistant:

string_stream parser::operator()(std::initializer_list<char const* const> init_list, T&& def_val) const
   {
      for (auto& name : init_list)
      {
         auto optIt = params_.find(trim_leading_dashes(name));
         if (params_.end() != optIt)
            return string_stream(optIt->second);
      }
      std::ostringstream ostr;
      ostr.precision(std::numeric_limits<long double>::max_digits10);
      ostr << def_val;
      return string_stream(ostr.str()); // use default
   }